

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

bool __thiscall
helics::CoreBroker::checkInterfaceCreation
          (CoreBroker *this,ActionMessage *message,InterfaceType type)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  bool bVar1;
  BrokerState BVar2;
  BasicHandleInfo *pBVar3;
  char *pcVar4;
  pointer pBVar5;
  InterfaceType in_DL;
  long in_RSI;
  long in_RDI;
  string_view sVar6;
  ActionMessage eret_2;
  ActionMessage eret_1;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  fed;
  ActionMessage eret;
  bool existingName;
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  *in_stack_fffffffffffffa38;
  ActionMessage *in_stack_fffffffffffffa40;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffa48;
  value<fmt::v11::context> *in_stack_fffffffffffffa50;
  ActionMessage *in_stack_fffffffffffffa58;
  HandleManager *in_stack_fffffffffffffa60;
  SmallBuffer *in_stack_fffffffffffffa68;
  char *in_stack_fffffffffffffa70;
  bool local_569;
  string_view local_560;
  string_view local_550;
  char *local_540;
  ActionMessage *in_stack_fffffffffffffac8;
  ActionMessage *cmd;
  CoreBroker *in_stack_fffffffffffffad0;
  GlobalFederateId local_504 [2];
  undefined4 local_4fc;
  undefined4 local_4ec;
  string_view local_448;
  string_view local_438;
  char *local_428;
  undefined8 local_420;
  undefined1 local_418 [36];
  undefined4 local_3f4;
  BaseType local_3f0;
  GlobalFederateId local_3ec [2];
  undefined4 local_3e4;
  undefined4 local_3d4;
  format_args in_stack_fffffffffffffca0;
  string_view in_stack_fffffffffffffcb0;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  local_328 [3];
  string_view local_310;
  string_view local_300;
  char *local_2f0;
  undefined8 local_2e8;
  undefined1 local_2e0 [36];
  undefined4 local_2bc;
  BaseType local_2b8;
  GlobalFederateId local_2b4 [2];
  undefined4 local_2ac;
  undefined4 local_29c;
  string_view local_1f8;
  string_view local_1e8;
  string_view local_1d8;
  string_view local_1c8;
  bool local_1b2;
  InterfaceType local_1b1;
  long local_1b0;
  byte local_199;
  undefined1 local_198 [32];
  undefined8 local_178;
  undefined1 *local_170;
  char *local_168;
  undefined8 uStack_160;
  string_view *local_150;
  string_view *local_148;
  char *local_140;
  undefined8 uStack_138;
  undefined1 *local_130;
  undefined1 local_128 [32];
  undefined8 local_108;
  undefined1 *local_100;
  char *local_f8;
  undefined8 uStack_f0;
  string_view *local_e0;
  string_view *local_d8;
  char *local_d0;
  undefined8 uStack_c8;
  undefined1 *local_c0;
  undefined1 local_b8 [48];
  undefined8 local_88;
  undefined1 *local_80;
  char *local_78;
  ActionMessage *pAStack_70;
  string_view *local_60;
  pointer local_58;
  string_view *local_50;
  char *local_48;
  ActionMessage *pAStack_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined8 *local_28;
  undefined1 *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_1b2 = false;
  local_1b1 = in_DL;
  local_1b0 = in_RSI;
  if (in_DL == TRANSLATOR) {
    local_1c8 = ActionMessage::name((ActionMessage *)0x51c310);
    name._M_str = in_stack_fffffffffffffa70;
    name._M_len = (size_t)in_stack_fffffffffffffa68;
    pBVar3 = HandleManager::getInterfaceHandle
                       (in_stack_fffffffffffffa60,name,
                        (InterfaceType)((ulong)in_stack_fffffffffffffa58 >> 0x38));
    local_569 = true;
    if (pBVar3 == (BasicHandleInfo *)0x0) {
      local_1d8 = ActionMessage::name((ActionMessage *)0x51c36f);
      name_00._M_str = in_stack_fffffffffffffa70;
      name_00._M_len = (size_t)in_stack_fffffffffffffa68;
      pBVar3 = HandleManager::getInterfaceHandle
                         (in_stack_fffffffffffffa60,name_00,
                          (InterfaceType)((ulong)in_stack_fffffffffffffa58 >> 0x38));
      local_569 = true;
      if (pBVar3 == (BasicHandleInfo *)0x0) {
        local_1e8 = ActionMessage::name((ActionMessage *)0x51c3ca);
        name_01._M_str = in_stack_fffffffffffffa70;
        name_01._M_len = (size_t)in_stack_fffffffffffffa68;
        pBVar3 = HandleManager::getInterfaceHandle
                           (in_stack_fffffffffffffa60,name_01,
                            (InterfaceType)((ulong)in_stack_fffffffffffffa58 >> 0x38));
        local_569 = pBVar3 != (BasicHandleInfo *)0x0;
      }
    }
    local_1b2 = local_569;
  }
  else {
    pcVar4 = (char *)(in_RDI + 0x438);
    local_1f8 = ActionMessage::name((ActionMessage *)0x51c430);
    sVar6._M_str = pcVar4;
    sVar6._M_len = (size_t)in_stack_fffffffffffffa68;
    pBVar3 = HandleManager::getInterfaceHandle
                       (in_stack_fffffffffffffa60,sVar6,
                        (InterfaceType)((ulong)in_stack_fffffffffffffa58 >> 0x38));
    local_1b2 = pBVar3 != (BasicHandleInfo *)0x0;
  }
  if (local_1b2 != false) {
    local_2b8 = *(BaseType *)(in_RDI + 0x14);
    GlobalFederateId::GlobalFederateId(local_2b4,(GlobalBrokerId)local_2b8);
    local_2bc = *(undefined4 *)(local_1b0 + 8);
    ActionMessage::ActionMessage
              (in_stack_fffffffffffffa58,(action_t)((ulong)in_stack_fffffffffffffa50 >> 0x20),
               (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffa60 >> 0x20),
               (GlobalFederateId)(BaseType)in_stack_fffffffffffffa60);
    local_29c = *(undefined4 *)(local_1b0 + 0xc);
    local_2ac = 0xffffffff;
    local_2f0 = "Duplicate {} names ({})";
    local_2e8 = 0x17;
    local_300 = interfaceTypeName(local_1b1);
    sVar6 = ActionMessage::name((ActionMessage *)0x51c539);
    local_c0 = local_2e0;
    local_d0 = local_2f0;
    uStack_c8 = local_2e8;
    local_d8 = &local_300;
    local_e0 = &local_310;
    local_f8 = local_2f0;
    uStack_f0 = local_2e8;
    local_310 = sVar6;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    local_28 = &local_108;
    local_30 = local_128;
    local_108 = 0xdd;
    local_100 = local_30;
    ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca0);
    SmallBuffer::operator=
              ((SmallBuffer *)sVar6._M_len,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar6._M_str);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa40);
    propagateError(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    local_199 = 0;
    ActionMessage::~ActionMessage(in_stack_fffffffffffffa40);
    goto LAB_0051ccd4;
  }
  if ((((*(byte *)(in_RDI + 0xe0) & 1) != 0) && (local_1b1 != INPUT)) &&
     (BVar2 = BrokerBase::getBrokerState((BrokerBase *)0x51c722), BVar2 == OPERATING)) {
    local_328[0] = gmlc::containers::
                   DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                   ::find((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                           *)in_stack_fffffffffffffa58,(GlobalFederateId *)in_stack_fffffffffffffa50
                         );
    gmlc::containers::
    DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
    ::end(in_stack_fffffffffffffa38);
    bVar1 = __gnu_cxx::
            operator==<helics::BasicFedInfo_*,_const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                      ((__normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                        *)in_stack_fffffffffffffa40,
                       (__normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                        *)in_stack_fffffffffffffa38);
    if (bVar1) {
      local_3f0 = *(BaseType *)(in_RDI + 0x14);
      GlobalFederateId::GlobalFederateId(local_3ec,(GlobalBrokerId)local_3f0);
      local_3f4 = *(undefined4 *)(local_1b0 + 8);
      ActionMessage::ActionMessage
                (in_stack_fffffffffffffa58,(action_t)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                 (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffa60 >> 0x20),
                 (GlobalFederateId)(BaseType)in_stack_fffffffffffffa60);
      local_3d4 = *(undefined4 *)(local_1b0 + 0xc);
      local_3e4 = 0xffffffff;
      local_428 = "Source {} not allowed after entering initializing mode ({})";
      local_420 = 0x3b;
      local_438 = interfaceTypeName(local_1b1);
      sVar6 = ActionMessage::name((ActionMessage *)0x51c83f);
      local_130 = local_418;
      local_140 = local_428;
      uStack_138 = local_420;
      local_148 = &local_438;
      local_150 = &local_448;
      local_168 = local_428;
      uStack_160 = local_420;
      local_448 = sVar6;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                ((value<fmt::v11::context> *)sVar6._M_str,in_stack_fffffffffffffa48);
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                ((value<fmt::v11::context> *)sVar6._M_str,in_stack_fffffffffffffa48);
      local_18 = &local_178;
      local_20 = local_198;
      local_178 = 0xdd;
      local_170 = local_20;
      ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca0);
      SmallBuffer::operator=
                (in_stack_fffffffffffffa68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa60);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa40);
      propagateError(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      local_199 = 0;
      ActionMessage::~ActionMessage(in_stack_fffffffffffffa40);
      goto LAB_0051ccd4;
    }
    pBVar5 = __gnu_cxx::
             __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
             ::operator->(local_328);
    if ((((pBVar5->observer & 1U) != 0) ||
        (pBVar5 = __gnu_cxx::
                  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                  ::operator->(local_328), (pBVar5->dynamic & 1U) == 0)) ||
       (pBVar5 = __gnu_cxx::
                 __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                 ::operator->(local_328), pBVar5->state != CONNECTED)) {
      GlobalFederateId::GlobalFederateId(local_504,(GlobalBrokerId)*(BaseType *)(in_RDI + 0x14));
      ActionMessage::ActionMessage
                (in_stack_fffffffffffffa58,(action_t)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                 (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffa60 >> 0x20),
                 (GlobalFederateId)(BaseType)in_stack_fffffffffffffa60);
      local_4ec = *(undefined4 *)(local_1b0 + 0xc);
      local_4fc = 0xffffffff;
      local_540 = "Source {} from {} not allowed after entering initializing mode ({})";
      cmd = (ActionMessage *)0x43;
      local_550 = interfaceTypeName(local_1b1);
      pBVar5 = __gnu_cxx::
               __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
               ::operator->(local_328);
      sVar6 = ActionMessage::name((ActionMessage *)0x51cafc);
      local_38 = &stack0xfffffffffffffad0;
      local_48 = local_540;
      local_50 = &local_550;
      local_60 = &local_560;
      local_78 = local_540;
      pAStack_70 = cmd;
      local_58 = pBVar5;
      pAStack_40 = cmd;
      local_560 = sVar6;
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                (in_stack_fffffffffffffa50,
                 (basic_string_view<char,_std::char_traits<char>_> *)sVar6._M_len);
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                (in_stack_fffffffffffffa50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar6._M_len);
      ::fmt::v11::detail::value<fmt::v11::context>::
      value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                (in_stack_fffffffffffffa50,
                 (basic_string_view<char,_std::char_traits<char>_> *)sVar6._M_len);
      local_8 = &local_88;
      local_10 = local_b8;
      local_88 = 0xddd;
      local_80 = local_10;
      ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca0);
      SmallBuffer::operator=
                (in_stack_fffffffffffffa68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa60);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar6._M_str);
      propagateError(in_stack_fffffffffffffad0,cmd);
      local_199 = 0;
      ActionMessage::~ActionMessage((ActionMessage *)sVar6._M_str);
      goto LAB_0051ccd4;
    }
  }
  local_199 = 1;
LAB_0051ccd4:
  return (bool)(local_199 & 1);
}

Assistant:

bool CoreBroker::checkInterfaceCreation(ActionMessage& message, InterfaceType type)
{
    bool existingName{false};
    if (type == InterfaceType::TRANSLATOR) {
        existingName =
            (handles.getInterfaceHandle(message.name(), InterfaceType::ENDPOINT) != nullptr ||
             handles.getInterfaceHandle(message.name(), InterfaceType::INPUT) != nullptr ||
             handles.getInterfaceHandle(message.name(), InterfaceType::PUBLICATION) != nullptr);
    } else {
        existingName = (handles.getInterfaceHandle(message.name(), type) != nullptr);
    }

    // detect duplicate InterfaceName;
    if (existingName) {
        ActionMessage eret(CMD_LOCAL_ERROR, global_broker_id_local, message.source_id);
        eret.dest_handle = message.source_handle;
        eret.messageID = defs::Errors::REGISTRATION_FAILURE;
        eret.payload =
            fmt::format("Duplicate {} names ({})", interfaceTypeName(type), message.name());
        propagateError(std::move(eret));
        return false;
    }
    if (disableDynamicSources && type != InterfaceType::INPUT) {
        if (getBrokerState() == BrokerState::OPERATING) {
            auto fed = mFederates.find(message.source_id);
            if (fed == mFederates.end()) {
                ActionMessage eret(CMD_LOCAL_ERROR, global_broker_id_local, message.source_id);
                eret.dest_handle = message.source_handle;
                eret.messageID = defs::Errors::REGISTRATION_FAILURE;
                eret.payload =
                    fmt::format("Source {} not allowed after entering initializing mode ({})",
                                interfaceTypeName(type),
                                message.name());
                propagateError(std::move(eret));
                return false;
            }
            if (fed->observer || !fed->dynamic || fed->state != ConnectionState::CONNECTED) {
                ActionMessage eret(CMD_LOCAL_ERROR, global_broker_id_local, message.source_id);
                eret.dest_handle = message.source_handle;
                eret.messageID = defs::Errors::REGISTRATION_FAILURE;
                eret.payload = fmt::format(
                    "Source {} from {} not allowed after entering initializing mode ({})",
                    interfaceTypeName(type),
                    fed->name,
                    message.name());
                propagateError(std::move(eret));
                return false;
            }
        }
    }
    return true;
}